

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_ocaml_generator.cc
# Opt level: O2

void __thiscall t_ocaml_generator::generate_typedef(t_ocaml_generator *this,t_typedef *ttypedef)

{
  ostream *poVar1;
  t_type *ptVar2;
  string sStack_c8;
  string local_a8;
  string local_88;
  string local_68;
  string local_48;
  
  t_generator::indent_abi_cxx11_(&local_88,(t_generator *)this);
  poVar1 = std::operator<<((ostream *)&this->f_types_,(string *)&local_88);
  poVar1 = std::operator<<(poVar1,"type ");
  std::__cxx11::string::string((string *)&local_48,(string *)&ttypedef->symbolic_);
  t_generator::decapitalize(&local_a8,(t_generator *)this,&local_48);
  poVar1 = std::operator<<(poVar1,(string *)&local_a8);
  poVar1 = std::operator<<(poVar1," = ");
  ptVar2 = t_typedef::get_type(ttypedef);
  render_ocaml_type_abi_cxx11_(&sStack_c8,this,ptVar2);
  poVar1 = std::operator<<(poVar1,(string *)&sStack_c8);
  poVar1 = std::operator<<(poVar1,(string *)&::endl_abi_cxx11_);
  std::operator<<(poVar1,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&sStack_c8);
  std::__cxx11::string::~string((string *)&local_a8);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_88);
  t_generator::indent_abi_cxx11_(&local_88,(t_generator *)this);
  poVar1 = std::operator<<((ostream *)&this->f_types_i_,(string *)&local_88);
  poVar1 = std::operator<<(poVar1,"type ");
  std::__cxx11::string::string((string *)&local_68,(string *)&ttypedef->symbolic_);
  t_generator::decapitalize(&local_a8,(t_generator *)this,&local_68);
  poVar1 = std::operator<<(poVar1,(string *)&local_a8);
  poVar1 = std::operator<<(poVar1," = ");
  ptVar2 = t_typedef::get_type(ttypedef);
  render_ocaml_type_abi_cxx11_(&sStack_c8,this,ptVar2);
  poVar1 = std::operator<<(poVar1,(string *)&sStack_c8);
  poVar1 = std::operator<<(poVar1,(string *)&::endl_abi_cxx11_);
  std::operator<<(poVar1,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&sStack_c8);
  std::__cxx11::string::~string((string *)&local_a8);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string((string *)&local_88);
  return;
}

Assistant:

void t_ocaml_generator::generate_typedef(t_typedef* ttypedef) {
  f_types_ << indent() << "type " << decapitalize(ttypedef->get_symbolic()) << " = "
           << render_ocaml_type(ttypedef->get_type()) << endl << endl;
  f_types_i_ << indent() << "type " << decapitalize(ttypedef->get_symbolic()) << " = "
             << render_ocaml_type(ttypedef->get_type()) << endl << endl;
}